

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_set.c
# Opt level: O3

int mpt_meta_set(mpt_metatype **mptr,mpt_value *val)

{
  mpt_metatype *pmVar1;
  int iVar2;
  int iVar3;
  mpt_metatype *pmVar4;
  mpt_value tmp;
  mpt_config *cfg;
  mpt_object *obj;
  mpt_value local_48;
  long *local_38;
  mpt_object *local_30;
  
  pmVar1 = *mptr;
  if (pmVar1 == (mpt_metatype *)0x0) {
    if (val != (mpt_value *)0x0) goto LAB_00115cac;
    local_48._addr = (long *)0x0;
  }
  else {
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0,(void *)0x0);
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    local_30 = (mpt_object *)0x0;
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x84,&local_30);
    if (local_30 != (mpt_object *)0x0 && -1 < iVar2) {
      if (val != (mpt_value *)0x0) {
        local_48._addr = val->_addr;
        local_48._type = val->_type;
        iVar2 = mpt_object_set_value(local_30,(char *)0x0,&local_48);
        if (-1 < iVar2) {
          return iVar3;
        }
        return iVar2;
      }
      iVar2 = (*local_30->_vptr->set_property)(local_30,(char *)0x0,(mpt_convertable *)0x0);
      if (-1 < iVar2) {
        return iVar3;
      }
    }
    local_38 = (long *)0x0;
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x85,&local_38);
    if ((-1 < iVar2 && local_38 != (long *)0x0) &&
       (iVar3 = (**(code **)(*local_38 + 8))(local_38,0,val), -1 < iVar3)) {
      return iVar3;
    }
    if (val != (mpt_value *)0x0) {
LAB_00115cac:
      pmVar4 = mpt_meta_new(val);
      if (pmVar4 == (mpt_metatype *)0x0) {
        return -4;
      }
      iVar2 = (*(pmVar4->_vptr->convertable).convert)((mpt_convertable *)pmVar4,0,(void *)0x0);
      iVar3 = 0;
      if (0 < iVar2) {
        iVar3 = iVar2;
      }
      goto LAB_00115d23;
    }
    local_48._addr = (long *)0x0;
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x86,&local_48);
    if (((long *)local_48._addr != (long *)0x0 && -1 < iVar2) &&
       (iVar2 = (**(code **)(*local_48._addr + 0x10))(), -1 < iVar2)) {
      return iVar3;
    }
  }
  pmVar4 = mpt_metatype_default();
  iVar3 = 0;
LAB_00115d23:
  if (pmVar1 != (mpt_metatype *)0x0) {
    (*pmVar1->_vptr->unref)(pmVar1);
  }
  *mptr = pmVar4;
  return iVar3;
}

Assistant:

extern int mpt_meta_set(MPT_INTERFACE(metatype) **mptr, const MPT_STRUCT(value) *val)
{
	
	MPT_INTERFACE(metatype) *old, *mt;
	int ret = 0;
	
	if ((old = *mptr)) {
		/* try assign existing data */
		MPT_INTERFACE(object) *obj;
		MPT_INTERFACE(config) *cfg;
		
		if ((ret = MPT_metatype_convert(old, 0, 0)) < 0) {
			ret = 0;
		}
		obj = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeObjectPtr), &obj)) >= 0
		 && obj) {
			int err;
			if (val) {
				MPT_STRUCT(value) tmp = *val;
				if ((err = mpt_object_set_value(obj, 0, &tmp)) < 0) {
					return err;
				}
				return ret;
			}
			if ((err = obj->_vptr->set_property(obj, 0, 0)) >= 0) {
				return ret;
			}
		}
		cfg = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeConfigPtr), &cfg)) >= 0
		    && cfg
		    && (ret = cfg->_vptr->assign(cfg, 0, val)) >= 0) {
			return ret;
		}
	}
	/* default config data */
	if (!val) {
		/* try to reset existing iterator */
		MPT_INTERFACE(iterator) *it = 0;
		
		if (old
		    && MPT_metatype_convert(old, MPT_ENUM(TypeIteratorPtr), &it) >= 0
		    && it
		    && it->_vptr->reset(it) >= 0) {
			return ret;
		}
		mt = mpt_metatype_default();
		ret = 0;
	}
	/* create new metatype for data */
	else if (!(mt = mpt_meta_new(val))) {
		return MPT_ERROR(BadOperation);
	}
	else if ((ret = MPT_metatype_convert(mt, 0, 0)) < 0) {
		ret = 0;
	}
	if (old) {
		old->_vptr->unref(old);
	}
	*mptr = mt;
	return ret;
}